

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishString(HelicsPublication pub,char *str,HelicsError *err)

{
  Publication *this;
  PublicationObject *pPVar1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    this = pPVar1->pubPtr;
    local_28._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    local_28._M_str = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (str != (char *)0x0) {
      local_28._M_len = strlen(str);
      local_28._M_str = str;
    }
    helics::Publication::publish<std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_28);
  }
  return;
}

Assistant:

void helicsPublicationPublishString(HelicsPublication pub, const char* str, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(AS_STRING_VIEW(str));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}